

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool is_id_char(int32_t c)

{
  undefined1 local_d;
  int32_t c_local;
  
  local_d = true;
  if ((c != 0x5f) && (local_d = true, c != 0x27)) {
    local_d = is_identifier_char(c);
  }
  return local_d;
}

Assistant:

static bool is_id_char(const int32_t c) {
  return c == '_' || c == '\'' || is_identifier_char(c);
}